

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitstreamDecoder.cpp
# Opt level: O1

void scan_bitstream_mx(TrackData *trackdata)

{
  DataRate datarate_;
  bool bVar1;
  bool bVar2;
  byte bVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  byte bVar6;
  int iVar7;
  int size_;
  BitBuffer *this;
  LogHelper *pLVar8;
  ushort uVar9;
  uint sector_;
  ulong uVar10;
  ushort uVar11;
  uint8_t lsb;
  Data block;
  uint8_t msb;
  Track track;
  Sector sector;
  byte local_dd;
  uint local_dc;
  Data local_d8;
  uint local_bc;
  TrackData *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  Track local_90;
  undefined1 local_70 [40];
  vector<Data,_std::allocator<Data>_> local_48;
  
  Track::Track(&local_90,0);
  local_d8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (uchar *)0x0;
  local_d8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (uchar *)0x0;
  local_d8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (uchar *)0x0;
  local_b8 = trackdata;
  this = TrackData::bitstream(trackdata);
  BitBuffer::seek(this,0);
  this->encoding = FM;
  local_90.tracklen = BitBuffer::track_bitsize(this);
  local_dc = 0;
  uVar10 = 0;
  bVar1 = false;
  while (bVar2 = BitBuffer::wrapped(this), !bVar2) {
    iVar7 = Track::size(&local_90);
    if (iVar7 == 0) {
      iVar7 = BitBuffer::tell(this);
      if ((bool)(local_90.tracklen < iVar7 | bVar1)) break;
    }
    else if (bVar1) break;
    bVar3 = BitBuffer::read1(this);
    uVar10 = uVar10 * 2 | (ulong)bVar3;
    if (uVar10 == 0x88888888aaaa88aa) {
      if (opt.debug != 0) {
        pLVar8 = util::operator<<((LogHelper *)&util::cout,(char (*) [24])"  s_b_mx found sync at ")
        ;
        local_70._0_4_ = BitBuffer::tell(this);
        pLVar8 = util::operator<<(pLVar8,(int *)local_70);
        util::operator<<(pLVar8,(char (*) [2])0x1ad42e);
      }
      uVar4 = BitBuffer::read_byte(this);
      uVar5 = BitBuffer::read_byte(this);
      local_bc = (uint)CONCAT11(uVar4,uVar5);
      sector_ = 0;
      do {
        datarate_ = this->datarate;
        iVar7 = (local_b8->cylhead).head;
        size_ = SizeToCode(0x100);
        Header::Header((Header *)&local_b0,local_bc,iVar7,sector_,size_);
        Sector::Sector((Sector *)local_70,datarate_,MX,(Header *)&local_b0,0);
        iVar7 = BitBuffer::tell(this);
        local_70._24_4_ = BitBuffer::track_offset(this,iVar7);
        if (local_d8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_d8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start) {
          local_d8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_d8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        iVar7 = 0x80;
        uVar11 = 0;
        do {
          local_b0._M_dataplus._M_p._0_1_ = BitBuffer::read_byte(this);
          bVar6 = BitBuffer::read_byte(this);
          bVar3 = (byte)local_b0._M_dataplus._M_p;
          local_dd = bVar6;
          if (local_d8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_d8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            _M_realloc_insert<unsigned_char_const&>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_d8,
                       (iterator)
                       local_d8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_dd);
          }
          else {
            *local_d8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish = bVar6;
            local_d8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_d8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          if (local_d8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_d8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            _M_realloc_insert<unsigned_char_const&>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_d8,
                       (iterator)
                       local_d8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish,(uchar *)&local_b0);
          }
          else {
            *local_d8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish = (byte)local_b0._M_dataplus._M_p;
            local_d8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_d8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          uVar11 = uVar11 + bVar6 + (ushort)bVar3 * 0x100;
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
        uVar4 = BitBuffer::read_byte(this);
        uVar5 = BitBuffer::read_byte(this);
        uVar9 = CONCAT11(uVar4,uVar5);
        if (opt.debug != 0) {
          util::fmt_abi_cxx11_
                    (&local_b0,"cksum s %2d disk:calc %06o:%06o (%04x:%04x)\n",(ulong)sector_,
                     (ulong)(uint)CONCAT11(uVar4,uVar5),(ulong)(uint)uVar11,
                     (ulong)(uint)CONCAT11(uVar4,uVar5),(uint)uVar11);
          util::operator<<((LogHelper *)&util::cout,&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_b0._M_dataplus._M_p._1_7_,(byte)local_b0._M_dataplus._M_p) !=
              &local_b0.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_b0._M_dataplus._M_p._1_7_,(byte)local_b0._M_dataplus._M_p
                                    ),local_b0.field_2._M_allocated_capacity + 1);
          }
        }
        if (uVar11 == uVar9) {
          Sector::add((Sector *)local_70,&local_d8,(bool)(uVar9 == 0 & (byte)local_dc),'\0');
        }
        else {
          Sector::add((Sector *)local_70,&local_d8,true,'\0');
          local_dc = local_dc & 0xff;
          if (uVar9 == 0) {
            local_dc = 1;
          }
        }
        Track::add(&local_90,(Sector *)local_70);
        std::vector<Data,_std::allocator<Data>_>::~vector(&local_48);
        sector_ = sector_ + 1;
      } while (sector_ != 0xb);
      uVar4 = BitBuffer::read_byte(this);
      uVar5 = BitBuffer::read_byte(this);
      bVar1 = true;
      uVar10 = 0x88888888aaaa88aa;
      if (opt.debug != 0) {
        util::fmt_abi_cxx11_
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                   "  s_b_mx c:h %d:%d stored %d extra %06o\n",(ulong)(uint)(local_b8->cylhead).cyl,
                   (ulong)(uint)(local_b8->cylhead).head,(ulong)local_bc,
                   (ulong)CONCAT11(uVar4,uVar5));
        util::operator<<((LogHelper *)&util::cout,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_70);
        if ((undefined1 *)CONCAT44(local_70._4_4_,local_70._0_4_) != local_70 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_70._4_4_,local_70._0_4_),local_70._16_8_ + 1)
          ;
        }
        uVar10 = 0x88888888aaaa88aa;
      }
    }
  }
  TrackData::add(local_b8,&local_90);
  if (local_d8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_d8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<Sector,_std::allocator<Sector>_>::~vector(&local_90.m_sectors);
  return;
}

Assistant:

void scan_bitstream_mx(TrackData& trackdata)
{
    Track track;
    Data block;
    uint64_t dword = 0;
    uint16_t stored_cksum = 0, cksum = 0, stored_track = 0, extra = 0;
    bool zero_cksum = false;

    auto& bitbuf = trackdata.bitstream();
    bitbuf.seek(0);
    bitbuf.encoding = Encoding::FM;
    track.tracklen = bitbuf.track_bitsize();
    bool sync = false;

    while (!bitbuf.wrapped())
    {
        // Give up if no headers were found in the first revolution
        if (!track.size() && bitbuf.tell() > track.tracklen)
            break;

        // ignore sync sequences after first one
        if (sync)
            break;

        dword = (dword << 1) | bitbuf.read1();

        switch (dword)
        {
        case 0x88888888aaaa88aa:    // FM-encoded 0x00f3 (000363 octal)
            sync = true;
            if (opt.debug)
                util::cout << "  s_b_mx found sync at " << bitbuf.tell() << "\n";
            break;

        default:
            continue;
        }

        // skip track number
        stored_track = bitbuf.read_byte() << 8;
        stored_track |= bitbuf.read_byte();

        // read sectors
        for (auto s = 0; s < 11; s++) {
            Sector sector(bitbuf.datarate, Encoding::MX, Header(stored_track, trackdata.cylhead.head, s, SizeToCode(256)));
            sector.offset = bitbuf.track_offset(bitbuf.tell());

            block.clear();
            cksum = 0;

            for (auto i = 0; i < 128; i++) {
                auto msb = bitbuf.read_byte();
                auto lsb = bitbuf.read_byte();
                cksum += (lsb | (msb << 8));
                block.push_back(lsb);
                block.push_back(msb);
            }

            stored_cksum = bitbuf.read_byte() << 8;
            stored_cksum |= bitbuf.read_byte();

            if (opt.debug)
                util::cout << util::fmt("cksum s %2d disk:calc %06o:%06o (%04x:%04x)\n",
                    s, stored_cksum, cksum, stored_cksum, cksum);

            /*
             * Flux stream on some marginal disks may decode as stream of zero bits instead of valid
             * data, but checksum of all zeros is also zero...
             */
            if (cksum != stored_cksum)
            {
                sector.add(std::move(block), true, 0);
                if (stored_cksum == 0)
                {
                    zero_cksum = true;
                }
            }
            else
            {
                sector.add(std::move(block), (zero_cksum && stored_cksum == 0), 0);
            }
            track.add(std::move(sector));
        }

        extra = bitbuf.read_byte() << 8;
        extra |= bitbuf.read_byte();

        if (opt.debug)
            util::cout << util::fmt("  s_b_mx c:h %d:%d stored %d extra %06o\n",
                trackdata.cylhead.cyl, trackdata.cylhead.head, stored_track, extra);
    }

    trackdata.add(std::move(track));
}